

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::parse(Parser *this,QIODevice *input,QString *name)

{
  QList<LineNumber> *offsets;
  QRegularExpressionMatchIterator QVar1;
  Data *__filename;
  bool bVar2;
  char *pcVar3;
  qsizetype qVar4;
  iterator iVar5;
  iterator iVar6;
  iterator before;
  iterator iVar7;
  Function *func;
  QExplicitlySharedDataPointer<QRegularExpressionPrivate> QVar8;
  int iVar9;
  QList<Replace> *__range2;
  Replace *rep;
  long in_FS_OFFSET;
  QRegularExpressionMatch match;
  QRegularExpressionMatch match_1;
  QRegularExpression traceMacro;
  QRegularExpressionMatchIterator i;
  QArrayDataPointer<char16_t> local_c8;
  QRegularExpression includeMacro;
  QTextStream stream;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<QString> local_78;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  stream.d_ptr._M_t.
  super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
  super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
       (unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QTextStream::QTextStream(&stream,input);
  offsets = &this->m_offsets;
  iVar9 = 1;
  QVar8.d.ptr = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)
                (QRegularExpressionPrivate *)0x0;
  while( true ) {
    bVar2 = QTextStream::atEnd(&stream);
    if (bVar2) break;
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QTextStream::readLine((QString *)local_58,&stream,0);
    QString::trimmed_helper((QString *)&local_78,(QString *)local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
    local_58._8_8_ = local_78.size + (long)QVar8.d.ptr;
    local_48 = (undefined1 *)CONCAT44(local_48._4_4_,iVar9);
    iVar9 = iVar9 + 1;
    local_58._0_8_ = QVar8.d.ptr;
    QList<LineNumber>::emplaceBack<LineNumber>(offsets,(LineNumber *)local_58);
    QVar8.d.ptr = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)
                  (local_78.size + (long)((long)QVar8.d.ptr + 1));
    local_58[8] = 10;
    local_58._0_8_ = &local_78;
    operator+=((QString *)&local_98,(QStringBuilder<QString_&,_QLatin1Char> *)local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  }
  local_78.d = (Data *)0x0;
  local_58._0_8_ = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0;
  local_58._8_8_ = (char16_t *)0x0;
  local_78.ptr = (QString *)0x12947e;
  local_48 = (undefined1 *)0x0;
  local_78.size = 2;
  pcVar3 = (char *)QString::indexOf((QString *)&local_98,(QString *)&local_78,0,CaseSensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  while( true ) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
    if ((long)pcVar3 < 0) break;
    qVar4 = QString::indexOf((QString *)&local_98,(QChar)0xa,(qsizetype)pcVar3,CaseSensitive);
    if (qVar4 == -1) {
      qVar4 = local_98.size;
    }
    removeOffsetRange((qsizetype)pcVar3,qVar4,offsets);
    QString::remove((QString *)&local_98,pcVar3);
    local_58._0_8_ = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0;
    local_58._8_8_ = (char16_t *)0x0;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QString *)0x12947e;
    local_48 = (undefined1 *)0x0;
    local_78.size = 2;
    pcVar3 = (char *)QString::indexOf((QString *)&local_98,(QString *)&local_78,(qsizetype)pcVar3,
                                      CaseSensitive);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  }
  local_78.d = (Data *)0x0;
  local_58._0_8_ = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0;
  local_58._8_8_ = (char16_t *)0x0;
  local_78.ptr = (QString *)0x129484;
  local_48 = (undefined1 *)0x0;
  local_78.size = 2;
  pcVar3 = (char *)QString::indexOf((QString *)&local_98,(QString *)&local_78,0,CaseSensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
  if (-1 < (long)pcVar3) {
    do {
      local_58._0_8_ = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0;
      local_58._8_8_ = (char16_t *)0x0;
      local_78.d = (Data *)0x0;
      local_78.ptr = (QString *)0x12948a;
      local_48 = (undefined1 *)0x0;
      local_78.size = 2;
      qVar4 = QString::indexOf((QString *)&local_98,(QString *)&local_78,(qsizetype)pcVar3,
                               CaseSensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
      if (qVar4 == -1) break;
      removeOffsetRange((qsizetype)pcVar3,qVar4 + 2,offsets);
      QString::remove((QString *)&local_98,pcVar3);
      local_58._0_8_ = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0;
      local_58._8_8_ = (char16_t *)0x0;
      local_78.d = (Data *)0x0;
      local_78.ptr = (QString *)0x129484;
      local_48 = (undefined1 *)0x0;
      local_78.size = 2;
      pcVar3 = (char *)QString::indexOf((QString *)&local_98,(QString *)&local_78,(qsizetype)pcVar3,
                                        CaseSensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
    } while (-1 < (long)pcVar3);
  }
  local_78.d = (Data *)0x0;
  local_58._0_8_ = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0;
  QString::replace((QString *)&local_98,(QChar)0xa,(QChar)0x20,CaseSensitive);
  while( true ) {
    bVar2 = findSpaceRange((QString *)&local_98,(qsizetype *)&local_78,(qsizetype *)local_58);
    __filename = local_78.d;
    if (!bVar2) break;
    removeOffsetRange((qsizetype)local_78.d,local_58._0_8_,offsets);
    QString::remove((QString *)&local_98,(char *)__filename);
  }
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  includeMacro.d.d.ptr =
       (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0;
  local_c8.d = (Data *)0x0;
  local_c8.ptr = (char16_t *)0x0;
  local_58._8_8_ = L"#include [\"<]([A-Za-z0-9_./-]*.h)[\">]";
  local_c8.size = 0;
  local_48 = (undefined1 *)0x25;
  QRegularExpression::QRegularExpression(&includeMacro,(QString *)local_58,(PatternOptions)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  i.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
              &DAT_aaaaaaaaaaaaaaaa;
  QRegularExpression::globalMatch
            ((QRegularExpression *)&i,(QString *)&includeMacro,(qsizetype)&local_98,NormalMatch,
             (MatchOptions)0x0);
  while( true ) {
    bVar2 = QRegularExpressionMatchIterator::hasNext(&i);
    if (!bVar2) break;
    match.d.d.ptr =
         (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&match);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QRegularExpressionMatch::captured((QString *)local_58,&match,1);
    bVar2 = QString::startsWith((QString *)local_58,(QChar)0x71,CaseInsensitive);
    if (bVar2) {
      local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_c8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      resolveInclude((QString *)&local_c8,this,(QString *)local_58);
      if ((undefined1 *)local_c8.size != (undefined1 *)0x0) {
        bVar2 = QListSpecialMethods<QString>::contains
                          ((QListSpecialMethods<QString> *)&local_78,(QString *)&local_c8,
                           CaseSensitive);
        if (!bVar2) {
          QList<QString>::emplaceBack<QString_const&>
                    ((QList<QString> *)&local_78,(QString *)&local_c8);
          addIncludesRecursive(this,(QString *)&local_c8,(QList<QString> *)&local_78);
        }
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
    QRegularExpressionMatch::~QRegularExpressionMatch(&match);
  }
  traceMacro.d.d.ptr =
       (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)0x0;
  local_c8.d = (Data *)0x0;
  local_c8.ptr = (char16_t *)0x0;
  local_58._8_8_ = L"Q_TRACE_([A-Z_]*)";
  local_c8.size = 0;
  local_48 = (undefined1 *)0x11;
  QRegularExpression::QRegularExpression(&traceMacro,(QString *)local_58,(PatternOptions)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QRegularExpression::globalMatch
            ((QRegularExpression *)local_58,(QString *)&traceMacro,(qsizetype)&local_98,NormalMatch,
             (MatchOptions)0x0);
  QVar1 = i;
  i.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)
              (QExplicitlySharedDataPointer<QRegularExpressionMatchIteratorPrivate>)local_58._0_8_;
  local_58._0_8_ = QVar1.d.d.ptr;
  QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
            ((QRegularExpressionMatchIterator *)local_58);
  while( true ) {
    bVar2 = QRegularExpressionMatchIterator::hasNext(&i);
    if (!bVar2) break;
    match_1.d.d.ptr =
         (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&match_1);
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QRegularExpressionMatch::captured((QString *)local_58,&match_1,1);
    match.d.d.ptr =
         (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
         (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x0;
    local_c8.d = (Data *)0x0;
    local_c8.ptr = L"PARAM_REPLACE";
    local_c8.size = 0xd;
    bVar2 = comparesEqual((QString *)local_58,(QString *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
    if (bVar2) {
      qVar4 = QRegularExpressionMatch::capturedEnd(&match_1,0);
      parseParamReplace(this,(QString *)&local_98,qVar4,name);
    }
    else {
      match.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
           (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x0;
      local_c8.d = (Data *)0x0;
      local_c8.ptr = L"INSTRUMENT";
      local_c8.size = 10;
      bVar2 = comparesEqual((QString *)local_58,(QString *)&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
      if (bVar2) {
        qVar4 = QRegularExpressionMatch::capturedEnd(&match_1,0);
        parseInstrument(this,(QString *)&local_98,qVar4);
      }
      else {
        match.d.d.ptr =
             (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
             (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x0;
        local_c8.d = (Data *)0x0;
        local_c8.ptr = L"POINT";
        local_c8.size = 5;
        bVar2 = comparesEqual((QString *)local_58,(QString *)&local_c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
        if (bVar2) {
          qVar4 = QRegularExpressionMatch::capturedEnd(&match_1,0);
          parsePoint(this,(QString *)&local_98,qVar4);
        }
        else {
          match.d.d.ptr =
               (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
               (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x0;
          local_c8.d = (Data *)0x0;
          local_c8.ptr = L"PREFIX";
          local_c8.size = 6;
          bVar2 = comparesEqual((QString *)local_58,(QString *)&local_c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
          if (bVar2) {
            qVar4 = QRegularExpressionMatch::capturedEnd(&match_1,0);
            parsePrefix(this,(QString *)&local_98,qVar4);
          }
          else {
            match.d.d.ptr =
                 (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                 (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x0;
            local_c8.d = (Data *)0x0;
            local_c8.ptr = L"METADATA";
            local_c8.size = 8;
            bVar2 = comparesEqual((QString *)local_58,(QString *)&local_c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&match);
            if (bVar2) {
              qVar4 = QRegularExpressionMatch::capturedEnd(&match_1,0);
              parseMetadata(this,(QString *)&local_98,qVar4,(QStringList *)&local_78);
            }
          }
        }
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
    QRegularExpressionMatch::~QRegularExpressionMatch(&match_1);
  }
  iVar5 = QList<Function>::begin(&this->m_functions);
  iVar6 = QList<Function>::end(&this->m_functions);
  for (; iVar5.i != iVar6.i; iVar5.i = iVar5.i + 1) {
    before = QList<Replace>::begin(&this->m_replaces);
    iVar7 = QList<Replace>::end(&this->m_replaces);
    for (; before.i != iVar7.i; before.i = before.i + 1) {
      QString::replace(&(iVar5.i)->functionParameters,&(before.i)->in,&(before.i)->out,CaseSensitive
                      );
    }
  }
  QRegularExpression::~QRegularExpression(&traceMacro);
  QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator(&i);
  QRegularExpression::~QRegularExpression(&includeMacro);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  QTextStream::~QTextStream(&stream);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::parse(QIODevice &input, const QString &name)
{
    QString data;
    QTextStream stream(&input);
    int lineNumber = 1;
    qsizetype prev = 0;
    while (!stream.atEnd()) {
        QString line = stream.readLine().trimmed();
        m_offsets.push_back({prev, prev + line.length(), lineNumber++});
        prev += line.length() + 1;
        data += line + QLatin1Char(QLatin1Char('\n'));
    }

    simplifyData(data, m_offsets);

    QStringList includes;

    QRegularExpression includeMacro(QStringLiteral("#include [\"<]([A-Za-z0-9_./-]*.h)[\">]"));
    QRegularExpressionMatchIterator i = includeMacro.globalMatch(data);
    while (i.hasNext()) {
        QRegularExpressionMatch match = i.next();
        const QString filename = match.captured(1);
        // only search possible qt headers
        if (filename.startsWith(QLatin1Char('q'), Qt::CaseInsensitive)) {
            const QString resolved = resolveInclude(filename);
            if (!resolved.isEmpty() && !includes.contains(resolved)) {
                includes.push_back(resolved);
                addIncludesRecursive(resolved, includes);
            }
        }
    }

    QRegularExpression traceMacro(QStringLiteral("Q_TRACE_([A-Z_]*)"));
    i = traceMacro.globalMatch(data);
    while (i.hasNext()) {
        QRegularExpressionMatch match = i.next();

        QString macroType = match.captured(1);
        if (macroType == QStringLiteral("PARAM_REPLACE"))
            parseParamReplace(data, match.capturedEnd(), name);
        else if (macroType == QStringLiteral("INSTRUMENT"))
            parseInstrument(data, match.capturedEnd());
        else if (macroType == QStringLiteral("POINT"))
            parsePoint(data, match.capturedEnd());
        else if (macroType == QStringLiteral("PREFIX"))
            parsePrefix(data, match.capturedEnd());
        else if (macroType == QStringLiteral("METADATA"))
            parseMetadata(data, match.capturedEnd(), includes);
    }

    for (auto &func : m_functions) {
        for (auto &rep : m_replaces)
            func.functionParameters.replace(rep.in, rep.out);
    }
}